

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIntegerMixTests.cpp
# Opt level: O0

qpTestResult __thiscall deqp::ShaderIntegerMixRenderCase::test(ShaderIntegerMixRenderCase *this)

{
  void **ppvVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  GLenum GVar7;
  TestLog *log_00;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  ContextInfo *this_00;
  char *pcVar10;
  mapped_type *pmVar11;
  TestError *pTVar12;
  uint *puVar13;
  VertexArrayBinding *local_53e8;
  int local_5304;
  int local_52fc;
  int local_52f4;
  int local_52ec;
  Vector<int,_4> *local_52d8;
  int y_2;
  int x_2;
  int i_3;
  int local_51f4;
  int local_51f0;
  int y_1;
  int x_1;
  int i_2;
  undefined4 local_51d0;
  undefined1 local_51ca;
  allocator<char> local_51c9;
  GLint loc;
  allocator<char> local_51a1;
  string local_51a0;
  allocator<char> local_5179;
  string local_5178;
  allocator<char> local_5151;
  string local_5150;
  void **local_5130;
  undefined1 local_5128 [8];
  VertexArrayBinding vertexArrays [4];
  int i_1;
  undefined8 local_4fdc;
  int y;
  int x;
  int i;
  IVec4 expected [256];
  deInt32 sel [1024];
  deInt32 b [1024];
  deInt32 a [1024];
  float vertex [512];
  deUint32 pointIndices [256];
  GLuint local_3bc;
  GLuint local_3b8;
  GLuint tex;
  GLuint fbo;
  allocator<char> local_389;
  string local_388;
  ProgramSources local_368;
  undefined1 local_298 [8];
  ShaderProgram prog;
  string local_1c0;
  StringTemplate local_1a0;
  undefined1 local_180 [8];
  string fs_code;
  string local_158;
  StringTemplate local_138;
  undefined1 local_118 [8];
  string vs_code;
  key_type local_f0;
  allocator<char> local_c9;
  key_type local_c8;
  allocator<char> local_a1;
  key_type local_a0;
  undefined1 local_70 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  char *pcStack_38;
  bool is_es;
  char *extension_enable;
  bool pass;
  Functions *gl;
  TestLog *log;
  ShaderIntegerMixRenderCase *this_local;
  long lVar9;
  
  log_00 = tcu::TestContext::getLog
                     ((this->super_ShaderIntegerMixCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  pRVar8 = deqp::Context::getRenderContext
                     ((this->super_ShaderIntegerMixCase).super_TestCase.m_context);
  iVar5 = (*pRVar8->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar5);
  bVar3 = true;
  args._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
       glu::glslVersionIsES((this->super_ShaderIntegerMixCase).m_glslVersion);
  if ((((bool)args._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_) &&
      ((int)(this->super_ShaderIntegerMixCase).m_glslVersion < 2)) ||
     (!(bool)args._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_)) {
    this_00 = deqp::Context::getContextInfo
                        ((this->super_ShaderIntegerMixCase).super_TestCase.m_context);
    bVar4 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_shader_integer_mix");
    if (!bVar4) {
      return QP_TEST_RESULT_NOT_SUPPORTED;
    }
    pcStack_38 = "#extension GL_EXT_shader_integer_mix: enable";
  }
  else {
    pcStack_38 = "";
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_70);
  pcVar10 = glu::getGLSLVersionDeclaration((this->super_ShaderIntegerMixCase).m_glslVersion);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"VERSION_DECL",&local_a1);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_70,&local_a0);
  std::__cxx11::string::operator=((string *)pmVar11,pcVar10);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"EXTENSION_ENABLE",&local_c9);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_70,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar11,pcStack_38);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  pcVar10 = this->type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"TYPE",(allocator<char> *)(vs_code.field_2._M_local_buf + 0xf));
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_70,&local_f0);
  std::__cxx11::string::operator=((string *)pmVar11,pcVar10);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)(vs_code.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,
             "${VERSION_DECL}\n${EXTENSION_ENABLE}\n\nin vec2 vertex;\nin ivec4 vs_in_a;\nin ivec4 vs_in_b;\nin ivec4 vs_in_sel;\n\nflat out ivec4 fs_in_a;\nflat out ivec4 fs_in_b;\nflat out ivec4 fs_in_sel;\nflat out ivec4 fs_in_result;\n\nvoid main()\n{\n    fs_in_a = vs_in_a;\n    fs_in_b = vs_in_b;\n    fs_in_sel = vs_in_sel;\n\n    ${TYPE} a = ${TYPE}(vs_in_a);\n    ${TYPE} b = ${TYPE}(vs_in_b);\n    bvec4 sel = bvec4(vs_in_sel);\n    fs_in_result = ivec4(mix(a, b, sel));\n\n    gl_Position = vec4(vertex, 0, 1);\n    gl_PointSize = 4.;\n}\n"
             ,(allocator<char> *)(fs_code.field_2._M_local_buf + 0xf));
  tcu::StringTemplate::StringTemplate(&local_138,&local_158);
  tcu::StringTemplate::specialize
            ((string *)local_118,&local_138,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_70);
  tcu::StringTemplate::~StringTemplate(&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)(fs_code.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,
             "${VERSION_DECL}\n${EXTENSION_ENABLE}\n\nout ivec4 o;\n\nflat in ivec4 fs_in_a;\nflat in ivec4 fs_in_b;\nflat in ivec4 fs_in_sel;\nflat in ivec4 fs_in_result;\n\nuniform bool use_vs_data;\n\nvoid main()\n{\n    if (use_vs_data)\n        o = fs_in_result;\n    else {\n        ${TYPE} a = ${TYPE}(fs_in_a);\n        ${TYPE} b = ${TYPE}(fs_in_b);\n        bvec4 sel = bvec4(fs_in_sel);\n        o = ivec4(mix(a, b, sel));\n    }\n}\n"
             ,(allocator<char> *)((long)&prog.m_program.m_info.linkTimeUs + 7));
  tcu::StringTemplate::StringTemplate(&local_1a0,&local_1c0);
  tcu::StringTemplate::specialize
            ((string *)local_180,&local_1a0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_70);
  tcu::StringTemplate::~StringTemplate(&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&prog.m_program.m_info.linkTimeUs + 7))
  ;
  pRVar8 = deqp::Context::getRenderContext
                     ((this->super_ShaderIntegerMixCase).super_TestCase.m_context);
  pcVar10 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,pcVar10,&local_389);
  pcVar10 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fbo,pcVar10,(allocator<char> *)((long)&tex + 3));
  glu::makeVtxFragSources(&local_368,&local_388,(string *)&fbo);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_298,pRVar8,&local_368);
  glu::ProgramSources::~ProgramSources(&local_368);
  std::__cxx11::string::~string((string *)&fbo);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tex + 3));
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  bVar4 = glu::ShaderProgram::isOk((ShaderProgram *)local_298);
  if (bVar4) {
    bVar4 = glu::glslVersionIsES((this->super_ShaderIntegerMixCase).m_glslVersion);
    if (!bVar4) {
      glwEnable(0x8642);
    }
    glwGenTextures(1,&local_3bc);
    glwBindTexture(0xde1,local_3bc);
    glwTexImage2D(0xde1,0,0x8d82,0x40,0x40,0,0x8d99,0x1404,(void *)0x0);
    glwBindTexture(0xde1,0);
    glwGenFramebuffers(1,&local_3b8);
    glwBindFramebuffer(0x8ca9,local_3b8);
    glwBindFramebuffer(0x8ca8,local_3b8);
    glwFramebufferTexture2D(0x8ca9,0x8ce0,0xde1,local_3bc,0);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Creation of rendering FBO failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderIntegerMixTests.cpp"
                    ,0x184);
    GVar7 = glwCheckFramebufferStatus(0x8ca9);
    if (GVar7 == 0x8cd5) {
      glwViewport(0,0,0x40,0x40);
      local_52d8 = (Vector<int,_4> *)&x;
      do {
        tcu::Vector<int,_4>::Vector(local_52d8);
        local_52d8 = local_52d8 + 1;
      } while (local_52d8 != (Vector<int,_4> *)(expected[0xff].m_data + 2));
      for (y = 0; y < 0x100; y = y + 1) {
        vertex[(long)y + 0x1fe] = (float)(y & 0xffff);
        a[(long)(y << 1) + 0x3fe] = (deInt32)(((float)((y / 0x10) * 4 + 2) * 2.0) / 64.0 - 1.0);
        a[(long)(y * 2 + 1) + 0x3fe] = (deInt32)(((float)((y % 0x10) * 4 + 2) * 2.0) / 64.0 - 1.0);
        b[(long)(y << 2) + 0x3fe] = y;
        b[(long)(y * 4 + 1) + 0x3fe] = y * 5;
        b[(long)(y * 4 + 2) + 0x3fe] = y * 7;
        b[(long)(y * 4 + 3) + 0x3fe] = y * 0xb;
        sel[(long)(y << 2) + 0x3fe] = b[(long)(y * 4 + 3) + 0x3fe] ^ 0xffffffff;
        sel[(long)(y * 4 + 1) + 0x3fe] = b[(long)(y * 4 + 2) + 0x3fe] ^ 0xffffffff;
        sel[(long)(y * 4 + 2) + 0x3fe] = b[(long)(y * 4 + 1) + 0x3fe] ^ 0xffffffff;
        sel[(long)(y * 4 + 3) + 0x3fe] = b[(long)(y << 2) + 0x3fe] ^ 0xffffffff;
        sel[(long)(y << 2) + -2] = y & 1;
        sel[(long)(y * 4 + 1) + -2] = y >> 1 & 1;
        sel[(long)(y * 4 + 2) + -2] = y >> 2 & 1;
        sel[(long)(y * 4 + 3) + -2] = y >> 3 & 1;
        if (sel[(long)(y << 2) + -2] == 0) {
          local_52ec = b[(long)(y << 2) + 0x3fe];
        }
        else {
          local_52ec = sel[(long)(y << 2) + 0x3fe];
        }
        if (sel[(long)(y * 4 + 1) + -2] == 0) {
          local_52f4 = b[(long)(y * 4 + 1) + 0x3fe];
        }
        else {
          local_52f4 = sel[(long)(y * 4 + 1) + 0x3fe];
        }
        if (sel[(long)(y * 4 + 2) + -2] == 0) {
          local_52fc = b[(long)(y * 4 + 2) + 0x3fe];
        }
        else {
          local_52fc = sel[(long)(y * 4 + 2) + 0x3fe];
        }
        if (sel[(long)(y * 4 + 3) + -2] == 0) {
          local_5304 = b[(long)(y * 4 + 3) + 0x3fe];
        }
        else {
          local_5304 = sel[(long)(y * 4 + 3) + 0x3fe];
        }
        tcu::Vector<int,_4>::Vector
                  ((Vector<int,_4> *)((long)&vertexArrays[3].pointer.data + 4),local_52ec,local_52f4
                   ,local_52fc,local_5304);
        *(undefined8 *)(&x + (long)y * 4) = stack0xffffffffffffb01c;
        *(undefined8 *)expected[y].m_data = local_4fdc;
      }
      if (*this->type == 'b') {
        for (vertexArrays[3].pointer.data._0_4_ = 0; (int)vertexArrays[3].pointer.data < 0x400;
            vertexArrays[3].pointer.data._0_4_ = (int)vertexArrays[3].pointer.data + 1) {
          b[(long)(int)vertexArrays[3].pointer.data + 0x3fe] =
               b[(long)(int)vertexArrays[3].pointer.data + 0x3fe] & 1;
          sel[(long)(int)vertexArrays[3].pointer.data + 0x3fe] =
               sel[(long)(int)vertexArrays[3].pointer.data + 0x3fe] & 1;
          iVar5 = (int)vertexArrays[3].pointer.data;
          if ((int)vertexArrays[3].pointer.data < 0) {
            iVar5 = (int)vertexArrays[3].pointer.data + 3;
          }
          puVar13 = (uint *)tcu::Vector<int,_4>::operator[]
                                      ((Vector<int,_4> *)(&x + (long)(iVar5 >> 2) * 4),0);
          *puVar13 = *puVar13 & 1;
          iVar5 = (int)vertexArrays[3].pointer.data;
          if ((int)vertexArrays[3].pointer.data < 0) {
            iVar5 = (int)vertexArrays[3].pointer.data + 3;
          }
          puVar13 = (uint *)tcu::Vector<int,_4>::operator[]
                                      ((Vector<int,_4> *)(&x + (long)(iVar5 >> 2) * 4),1);
          *puVar13 = *puVar13 & 1;
          iVar5 = (int)vertexArrays[3].pointer.data;
          if ((int)vertexArrays[3].pointer.data < 0) {
            iVar5 = (int)vertexArrays[3].pointer.data + 3;
          }
          puVar13 = (uint *)tcu::Vector<int,_4>::operator[]
                                      ((Vector<int,_4> *)(&x + (long)(iVar5 >> 2) * 4),2);
          *puVar13 = *puVar13 & 1;
          iVar5 = (int)vertexArrays[3].pointer.data;
          if ((int)vertexArrays[3].pointer.data < 0) {
            iVar5 = (int)vertexArrays[3].pointer.data + 3;
          }
          puVar13 = (uint *)tcu::Vector<int,_4>::operator[]
                                      ((Vector<int,_4> *)(&x + (long)(iVar5 >> 2) * 4),3);
          *puVar13 = *puVar13 & 1;
        }
      }
      local_51ca = 1;
      local_5130 = (void **)local_5128;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5150,"vertex",&local_5151)
      ;
      glu::va::Float((VertexArrayBinding *)local_5128,&local_5150,2,0x100,0,(float *)(a + 0x3fe));
      ppvVar1 = &vertexArrays[0].pointer.data;
      local_5130 = ppvVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5178,"vs_in_a",&local_5179);
      glu::va::Int32((VertexArrayBinding *)ppvVar1,&local_5178,4,0x100,0,b + 0x3fe);
      ppvVar1 = &vertexArrays[1].pointer.data;
      local_5130 = ppvVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_51a0,"vs_in_b",&local_51a1);
      glu::va::Int32((VertexArrayBinding *)ppvVar1,&local_51a0,4,0x100,0,sel + 0x3fe);
      ppvVar1 = &vertexArrays[2].pointer.data;
      local_5130 = ppvVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&loc,"vs_in_sel",&local_51c9);
      glu::va::Int32((VertexArrayBinding *)ppvVar1,(string *)&loc,4,0x100,0,
                     expected[0xff].m_data + 2);
      local_51ca = 0;
      std::__cxx11::string::~string((string *)&loc);
      std::allocator<char>::~allocator(&local_51c9);
      std::__cxx11::string::~string((string *)&local_51a0);
      std::allocator<char>::~allocator(&local_51a1);
      std::__cxx11::string::~string((string *)&local_5178);
      std::allocator<char>::~allocator(&local_5179);
      std::__cxx11::string::~string((string *)&local_5150);
      std::allocator<char>::~allocator(&local_5151);
      pcVar2 = *(code **)(lVar9 + 0xb48);
      dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_298);
      local_51d0 = (*pcVar2)(dVar6);
      pcVar2 = *(code **)(lVar9 + 0x1680);
      dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_298);
      (*pcVar2)(dVar6);
      glwClearBufferiv(0x1800,0,test::clear);
      (**(code **)(lVar9 + 0x14f0))(local_51d0,0);
      pRVar8 = deqp::Context::getRenderContext
                         ((this->super_ShaderIntegerMixCase).super_TestCase.m_context);
      dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_298);
      glu::pr::Points((PrimitiveList *)&x_1,0x100,(deUint32 *)(vertex + 0x1fe));
      glu::draw(pRVar8,dVar6,4,(VertexArrayBinding *)local_5128,(PrimitiveList *)&x_1,
                (DrawUtilCallback *)0x0);
      for (y_1 = 0; y_1 < 0x100; y_1 = y_1 + 1) {
        local_51f0 = (int)(((float)a[(long)(y_1 * 2) + 0x3fe] + 1.0) * 64.0 * 0.5);
        local_51f4 = (int)(((float)a[(long)(y_1 * 2 + 1) + 0x3fe] + 1.0) * 64.0 * 0.5);
        bVar4 = probe_pixel(this,log_00,"Fragment",local_51f0,local_51f4,
                            (IVec4 *)(&x + (long)y_1 * 4));
        if (!bVar4) {
          bVar3 = false;
        }
      }
      (**(code **)(lVar9 + 0x14f0))(local_51d0,1);
      pRVar8 = deqp::Context::getRenderContext
                         ((this->super_ShaderIntegerMixCase).super_TestCase.m_context);
      dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_298);
      glu::pr::Points((PrimitiveList *)&x_2,0x100,(deUint32 *)(vertex + 0x1fe));
      glu::draw(pRVar8,dVar6,4,(VertexArrayBinding *)local_5128,(PrimitiveList *)&x_2,
                (DrawUtilCallback *)0x0);
      for (y_2 = 0; y_2 < 0x100; y_2 = y_2 + 1) {
        bVar4 = probe_pixel(this,log_00,"Vertex",
                            (int)(((float)a[(long)(y_2 * 2) + 0x3fe] + 1.0) * 64.0 * 0.5),
                            (int)(((float)a[(long)(y_2 * 2 + 1) + 0x3fe] + 1.0) * 64.0 * 0.5),
                            (IVec4 *)(&x + (long)y_2 * 4));
        if (!bVar4) {
          bVar3 = false;
        }
      }
      glwDeleteFramebuffers(1,&local_3b8);
      glwDeleteTextures(1,&local_3bc);
      local_53e8 = (VertexArrayBinding *)&vertexArrays[3].pointer.data;
      do {
        local_53e8 = local_53e8 + -1;
        glu::VertexArrayBinding::~VertexArrayBinding(local_53e8);
      } while (local_53e8 != (VertexArrayBinding *)local_5128);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_298);
      std::__cxx11::string::~string((string *)local_180);
      std::__cxx11::string::~string((string *)local_118);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_70);
      return (uint)!bVar3;
    }
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Framebuffer not complete.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderIntegerMixTests.cpp"
               ,0x187);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  glu::operator<<(log_00,(ShaderProgram *)local_298);
  pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar12,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderIntegerMixTests.cpp"
             ,0x16e);
  __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

virtual qpTestResult test()
	{
		static const char vs_template[] = "${VERSION_DECL}\n"
										  "${EXTENSION_ENABLE}\n"
										  "\n"
										  "in vec2 vertex;\n"
										  "in ivec4 vs_in_a;\n"
										  "in ivec4 vs_in_b;\n"
										  "in ivec4 vs_in_sel;\n"
										  "\n"
										  "flat out ivec4 fs_in_a;\n"
										  "flat out ivec4 fs_in_b;\n"
										  "flat out ivec4 fs_in_sel;\n"
										  "flat out ivec4 fs_in_result;\n"
										  "\n"
										  "void main()\n"
										  "{\n"
										  "    fs_in_a = vs_in_a;\n"
										  "    fs_in_b = vs_in_b;\n"
										  "    fs_in_sel = vs_in_sel;\n"
										  "\n"
										  "    ${TYPE} a = ${TYPE}(vs_in_a);\n"
										  "    ${TYPE} b = ${TYPE}(vs_in_b);\n"
										  "    bvec4 sel = bvec4(vs_in_sel);\n"
										  "    fs_in_result = ivec4(mix(a, b, sel));\n"
										  "\n"
										  "    gl_Position = vec4(vertex, 0, 1);\n"
										  "    gl_PointSize = 4.;\n"
										  "}\n";

		static const char fs_template[] = "${VERSION_DECL}\n"
										  "${EXTENSION_ENABLE}\n"
										  "\n"
										  "out ivec4 o;\n"
										  "\n"
										  "flat in ivec4 fs_in_a;\n"
										  "flat in ivec4 fs_in_b;\n"
										  "flat in ivec4 fs_in_sel;\n"
										  "flat in ivec4 fs_in_result;\n"
										  "\n"
										  "uniform bool use_vs_data;\n"
										  "\n"
										  "void main()\n"
										  "{\n"
										  "    if (use_vs_data)\n"
										  "        o = fs_in_result;\n"
										  "    else {\n"
										  "        ${TYPE} a = ${TYPE}(fs_in_a);\n"
										  "        ${TYPE} b = ${TYPE}(fs_in_b);\n"
										  "        bvec4 sel = bvec4(fs_in_sel);\n"
										  "        o = ivec4(mix(a, b, sel));\n"
										  "    }\n"
										  "}\n";

		TestLog&			  log  = m_testCtx.getLog();
		const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
		bool				  pass = true;
		const char*			  extension_enable;
		bool				  is_es = glslVersionIsES(m_glslVersion);

		if ((is_es && (m_glslVersion < glu::GLSL_VERSION_310_ES)) || !is_es)
		{
			/* For versions that do not support this feature in Core it must be exposed via an extension. */
			if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_shader_integer_mix"))
			{
				return QP_TEST_RESULT_NOT_SUPPORTED;
			}

			extension_enable = "#extension GL_EXT_shader_integer_mix: enable";
		}
		else
		{
			extension_enable = "";
		}

		/* Generate the specialization of the shader for the specific
		 * type being tested.
		 */
		std::map<std::string, std::string> args;

		args["VERSION_DECL"]	 = glu::getGLSLVersionDeclaration(m_glslVersion);
		args["EXTENSION_ENABLE"] = extension_enable;
		args["TYPE"]			 = type;

		std::string vs_code = tcu::StringTemplate(vs_template).specialize(args);

		std::string fs_code = tcu::StringTemplate(fs_template).specialize(args);

		glu::ShaderProgram prog(m_context.getRenderContext(),
								glu::makeVtxFragSources(vs_code.c_str(), fs_code.c_str()));

		if (!prog.isOk())
		{
			log << prog;
			TCU_FAIL("Compile failed");
		}

		if (!glslVersionIsES(m_glslVersion))
			glEnable(GL_PROGRAM_POINT_SIZE);

		/* Generate an integer FBO for rendering.
		 */
		GLuint fbo;
		GLuint tex;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glTexImage2D(GL_TEXTURE_2D, 0 /* level */, GL_RGBA32I, width, height, 0 /* border */, GL_RGBA_INTEGER, GL_INT,
					 NULL /* data */);
		glBindTexture(GL_TEXTURE_2D, 0);

		glGenFramebuffers(1, &fbo);
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, fbo);
		glBindFramebuffer(GL_READ_FRAMEBUFFER, fbo);
		glFramebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, 0 /* level */);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Creation of rendering FBO failed.");

		if (glCheckFramebufferStatus(GL_DRAW_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
			TCU_FAIL("Framebuffer not complete.");

		glViewport(0, 0, width, height);

		/* Fill a VBO with some vertex data.
		 */
		deUint32   pointIndices[256];
		float	  vertex[DE_LENGTH_OF_ARRAY(pointIndices) * 2];
		deInt32	a[DE_LENGTH_OF_ARRAY(pointIndices) * 4];
		deInt32	b[DE_LENGTH_OF_ARRAY(a)];
		deInt32	sel[DE_LENGTH_OF_ARRAY(a)];
		tcu::IVec4 expected[DE_LENGTH_OF_ARRAY(pointIndices)];

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(pointIndices); i++)
		{
			pointIndices[i] = deUint16(i);

			const int x = (i / 16) * (width / 16) + (4 / 2);
			const int y = (i % 16) * (height / 16) + (4 / 2);

			vertex[(i * 2) + 0] = float(x) * 2.0f / float(width) - 1.0f;
			vertex[(i * 2) + 1] = float(y) * 2.0f / float(height) - 1.0f;

			a[(i * 4) + 0] = i;
			a[(i * 4) + 1] = i * 5;
			a[(i * 4) + 2] = i * 7;
			a[(i * 4) + 3] = i * 11;

			b[(i * 4) + 0] = ~a[(i * 4) + 3];
			b[(i * 4) + 1] = ~a[(i * 4) + 2];
			b[(i * 4) + 2] = ~a[(i * 4) + 1];
			b[(i * 4) + 3] = ~a[(i * 4) + 0];

			sel[(i * 4) + 0] = (i >> 0) & 1;
			sel[(i * 4) + 1] = (i >> 1) & 1;
			sel[(i * 4) + 2] = (i >> 2) & 1;
			sel[(i * 4) + 3] = (i >> 3) & 1;

			expected[i] = tcu::IVec4(
				sel[(i * 4) + 0] ? b[(i * 4) + 0] : a[(i * 4) + 0], sel[(i * 4) + 1] ? b[(i * 4) + 1] : a[(i * 4) + 1],
				sel[(i * 4) + 2] ? b[(i * 4) + 2] : a[(i * 4) + 2], sel[(i * 4) + 3] ? b[(i * 4) + 3] : a[(i * 4) + 3]);
		}

		/* Mask off all but the least significant bit for boolean
		 * types.
		 */
		if (type[0] == 'b')
		{
			for (int i = 0; i < DE_LENGTH_OF_ARRAY(a); i++)
			{
				a[i] &= 1;
				b[i] &= 1;

				expected[i / 4][0] &= 1;
				expected[i / 4][1] &= 1;
				expected[i / 4][2] &= 1;
				expected[i / 4][3] &= 1;
			}
		}

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("vertex", 2, DE_LENGTH_OF_ARRAY(pointIndices), 0, vertex),
			glu::va::Int32("vs_in_a", 4, DE_LENGTH_OF_ARRAY(pointIndices), 0, a),
			glu::va::Int32("vs_in_b", 4, DE_LENGTH_OF_ARRAY(pointIndices), 0, b),
			glu::va::Int32("vs_in_sel", 4, DE_LENGTH_OF_ARRAY(pointIndices), 0, sel)
		};

		/* Render and verify the results.  Rendering happens twice.
		 * The first time, use_vs_data is false, and the mix() result
		 * from the fragment shader is used.  The second time,
		 * use_vs_data is true, and the mix() result from the vertex
		 * shader is used.
		 */
		const GLint loc = gl.getUniformLocation(prog.getProgram(), "use_vs_data");
		gl.useProgram(prog.getProgram());

		static const GLint clear[] = { 1, 2, 3, 4 };
		glClearBufferiv(GL_COLOR, 0, clear);

		gl.uniform1i(loc, 0);
		glu::draw(m_context.getRenderContext(), prog.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays,
				  glu::pr::Points(DE_LENGTH_OF_ARRAY(pointIndices), pointIndices));

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(pointIndices); i++)
		{
			const int x = int((vertex[(i * 2) + 0] + 1.0f) * float(width) / 2.0f);
			const int y = int((vertex[(i * 2) + 1] + 1.0f) * float(height) / 2.0f);

			pass = probe_pixel(log, "Fragment", x, y, expected[i]) && pass;
		}

		gl.uniform1i(loc, 1);
		glu::draw(m_context.getRenderContext(), prog.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays,
				  glu::pr::Points(DE_LENGTH_OF_ARRAY(pointIndices), pointIndices));

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(pointIndices); i++)
		{
			const int x = int((vertex[(i * 2) + 0] + 1.0f) * float(width) / 2.0f);
			const int y = int((vertex[(i * 2) + 1] + 1.0f) * float(height) / 2.0f);

			pass = probe_pixel(log, "Vertex", x, y, expected[i]) && pass;
		}

		glDeleteFramebuffers(1, &fbo);
		glDeleteTextures(1, &tex);

		return pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL;
	}